

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined1 *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FloatFormat *fmt_00;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  reference ppFVar7;
  TestLog *this_02;
  ostream *poVar8;
  char *pcVar9;
  RenderContext *pRVar10;
  ulong uVar11;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar12;
  reference pvVar13;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar14;
  ShaderExecutor *pSVar15;
  undefined8 extraout_RAX;
  TestError *this_03;
  FloatFormat *pFVar16;
  IVal *this_04;
  const_reference pvVar17;
  IVal *value;
  reference value_00;
  TestLog *this_05;
  reference pvVar18;
  TestLog *this_06;
  TestLog *this_07;
  TestLog *this_08;
  double *value_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db_03;
  double dVar20;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  pointer local_1b80;
  MessageBuilder local_1b70;
  MessageBuilder local_19f0;
  int local_186c;
  MessageBuilder local_1868;
  string local_16e8;
  string local_16c8;
  string local_16a8;
  string local_1688;
  string local_1668;
  string local_1648;
  string local_1628;
  string local_1608;
  string local_15e8;
  string local_15c8;
  string local_15a8;
  string local_1588;
  string local_1568;
  string local_1548;
  undefined1 local_1528 [8];
  MessageBuilder builder;
  string local_13a0;
  IVal local_1380;
  allocator<char> local_11f9;
  string local_11f8;
  undefined1 local_11d0 [8];
  EvalContext ctx;
  IVal local_1186 [4];
  IVal local_1182 [2];
  IVal local_1180;
  IVal local_1000;
  Void local_e79;
  undefined1 local_e78 [7];
  IVal reference1_1;
  IVal reference0_1;
  pointer pVStack_cf0;
  bool result;
  size_t valueNdx;
  undefined1 local_ce0 [7];
  IVal reference1;
  IVal reference0;
  undefined1 local_b58 [5];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  void *outputArr [2];
  void *inputArr [4];
  DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor> local_999;
  undefined1 local_998 [8];
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  executor;
  Symbol local_968;
  Symbol local_930;
  Symbol local_8f8;
  Symbol local_8c0;
  Symbol local_888;
  Symbol local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  ApiType local_7d4;
  string local_7d0 [32];
  undefined1 local_7b0 [8];
  ostringstream os;
  MessageBuilder local_618;
  _Self local_498;
  _Self local_490;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  undefined1 local_160 [8];
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  undefined1 local_e8 [8];
  ShaderSpec spec;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Statement *stmt_local;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *inputs_local;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *variables_local;
  PrecisionCase *this_local;
  
  fmt_00 = getFormat(this);
  iVar3 = numInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  iVar4 = numOutputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  if (iVar3 < 1) {
    local_1b80 = (pointer)&DAT_00000001;
  }
  else {
    local_1b80 = (pointer)std::
                          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ::size(&inputs->in0);
  }
  outputs.out1.
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1b80;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)((long)&spec.source.field_2 + 8),(size_t)local_1b80);
  ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)local_e8);
  highpFmt._24_8_ = (this->m_ctx).highpFormat.m_maxValue;
  numErrors = (this->m_ctx).highpFormat.m_minExp;
  unique0x10001457 = (this->m_ctx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_ctx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_ctx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_ctx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)local_160);
  switch(iVar3) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    tcu::TestLog::operator<<
              ((MessageBuilder *)&oss.field_0x170,this_01,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&oss.field_0x170,(char (*) [12])"Statement: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,stmt);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&oss.field_0x170);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           *)&it);
    Statement::getUsedFuncs
              (stmt,(set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    local_490._M_node =
         (_Base_ptr)
         std::
         set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
         ::begin((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
    while( true ) {
      local_498._M_node =
           (_Base_ptr)
           std::
           set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           ::end((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
      bVar1 = std::operator!=(&local_490,&local_498);
      if (!bVar1) break;
      ppFVar7 = std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::
                operator*(&local_490);
      FuncBase::printDefinition
                (*ppFVar7,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::operator++
                (&local_490);
    }
    bVar1 = std::
            set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            ::empty((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    if (!bVar1) {
      log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      tcu::TestLog::operator<<(&local_618,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_618,(char (*) [24])"Reference definitions:\n")
      ;
      std::__cxx11::ostringstream::str();
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&os.field_0x170);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&os.field_0x170);
      tcu::MessageBuilder::~MessageBuilder(&local_618);
    }
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::~set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            *)&it);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b0);
    poVar8 = std::operator<<((ostream *)local_7b0,"precision ");
    pcVar9 = glu::getPrecisionName((this->m_ctx).precision);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::operator<<(poVar8," float;\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &spec.outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_7d0);
    std::__cxx11::string::~string(local_7d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b0);
    pRVar10 = getRenderContext(this);
    local_7d4.m_bits = (*pRVar10->_vptr_RenderContext[2])();
    local_e8._0_4_ = glu::getContextTypeGLSLVersion((ContextType)local_7d4.m_bits);
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::operator+(&local_818,"#extension ",&this->m_extension);
      std::operator+(&local_7f8,&local_818," : require\n");
      std::__cxx11::string::operator=
                ((string *)
                 &spec.outputs.
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec,(long)iVar3);
  switch(iVar3) {
  case 4:
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_850,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,3);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_850);
    ShaderExecUtil::Symbol::~Symbol(&local_850);
  case 3:
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_888,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,2);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_888);
    ShaderExecUtil::Symbol::~Symbol(&local_888);
  case 2:
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_8c0,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,1);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_8c0);
    ShaderExecUtil::Symbol::~Symbol(&local_8c0);
  case 1:
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
              ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           *)variables);
    makeSymbol<tcu::Matrix<float,4,4>>(&local_8f8,this,pVVar14);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,0);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_8f8);
    ShaderExecUtil::Symbol::~Symbol(&local_8f8);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec.inputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
  if (iVar4 != 1) {
    if (iVar4 != 2) goto LAB_025b6bd0;
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_930,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec.inputs.
                               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_930);
    ShaderExecUtil::Symbol::~Symbol(&local_930);
  }
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                       );
  makeSymbol<tcu::Matrix<float,4,4>>(&local_968,this,pVVar14);
  pvVar13 = std::
            vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                          *)&spec.inputs.
                             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ShaderExecUtil::Symbol::operator=(pvVar13,&local_968);
  ShaderExecUtil::Symbol::~Symbol(&local_968);
LAB_025b6bd0:
  de::toString<deqp::gls::BuiltinPrecisionTests::Statement>
            ((string *)
             &executor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data.field_0x8,stmt);
  this_00 = &executor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.field_0x8;
  std::__cxx11::string::operator=
            ((string *)(spec.globalDeclarations.field_2._M_local_buf + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pRVar10 = getRenderContext(this);
  pSVar15 = ShaderExecUtil::createExecutor(pRVar10,(this->m_ctx).shaderType,(ShaderSpec *)local_e8);
  de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>::DefaultDeleter(&local_999);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               *)local_998,pSVar15);
  outputArr[1] = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                 front(&inputs->in0);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in1);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in2);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in3);
  in0.m_data.m_data[3].m_data[3].m_hi =
       (double)std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
               front((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *
                     )((long)&spec.source.field_2 + 8));
  outputArr[0] = std::
                 vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                 ::front((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&outputs.out0.
                             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  dVar20 = log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  (*pSVar15->_vptr_ShaderExecutor[3])(SUB84(dVar20,0),pSVar15,extraout_RAX);
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  uVar5 = (*pSVar15->_vptr_ShaderExecutor[2])();
  if ((uVar5 & 1) == 0) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  (*pSVar15->_vptr_ShaderExecutor[5])();
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  value_01 = &in0.m_data.m_data[3].m_data[3].m_hi;
  (*pSVar15->_vptr_ShaderExecutor[6])
            (pSVar15,(ulong)outputs.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff,
             outputArr + 1);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                *)local_998);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_b58);
  Void::Void((Void *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 7));
  Void::Void((Void *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 6));
  Void::Void((Void *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 5));
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_ce0);
  Void::Void((Void *)((long)&valueNdx + 7));
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
            ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                         *)variables);
  Environment::bind<tcu::Matrix<float,4,4>>((Environment *)local_160,pVVar14,(IVal *)local_b58);
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,
             (IVal *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 7));
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in2).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,
             (IVal *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 6));
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,
             (IVal *)((long)&reference0.m_data.m_data[3].m_data[3].m_hi + 5));
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                       );
  Environment::bind<tcu::Matrix<float,4,4>>((Environment *)local_160,pVVar14,(IVal *)local_ce0);
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->out1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,(IVal *)((long)&valueNdx + 7));
  tcu::Matrix<tcu::Interval,_4,_4>::~Matrix((Matrix<tcu::Interval,_4,_4> *)local_ce0);
  tcu::Matrix<tcu::Interval,_4,_4>::~Matrix((Matrix<tcu::Interval,_4,_4> *)local_b58);
  pVStack_cf0 = (pointer)0x0;
  uVar19 = extraout_XMM0_Da_02;
  uVar21 = extraout_XMM0_Db_02;
  do {
    if (outputs.out1.
        super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage <= pVStack_cf0) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_1868,this_06,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_1868,(char (*) [10])"(Skipped ");
        local_186c = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_186c);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1868);
        uVar19 = extraout_XMM0_Da_05;
        uVar21 = extraout_XMM0_Db_05;
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_19f0,this_07,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_19f0,(char (*) [5])"All ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_19f0);
      }
      else {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_1b70,this_08,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1b70,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2ba4f58);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b70);
      }
      Environment::~Environment((Environment *)local_160);
      ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_e8);
      Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ::~Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
                  *)((long)&spec.source.field_2 + 8));
      return;
    }
    bVar1 = true;
    tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_e78);
    Void::Void(&local_e79);
    if (((ulong)pVStack_cf0 & 0xfff) == 0) {
      tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
    }
    pFVar16 = (FloatFormat *)
              std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&inputs->in0,(size_type)pVStack_cf0);
    round<tcu::Matrix<float,4,4>>
              (&local_1180,(BuiltinPrecisionTests *)fmt_00,pFVar16,(Matrix<float,_4,_4> *)value_01);
    convert<tcu::Matrix<float,4,4>>
              (&local_1000,(BuiltinPrecisionTests *)fmt_00,(FloatFormat *)&local_1180,
               (IVal *)value_01);
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
              ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           *)variables);
    this_04 = Environment::lookup<tcu::Matrix<float,4,4>>((Environment *)local_160,pVVar14);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=(this_04,&local_1000);
    tcu::Matrix<tcu::Interval,_4,_4>::~Matrix(&local_1000);
    tcu::Matrix<tcu::Interval,_4,_4>::~Matrix(&local_1180);
    pvVar17 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in1,(size_type)pVStack_cf0);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar17);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,local_1182);
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar12);
    pvVar17 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in2,(size_type)pVStack_cf0);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar17);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,local_1186);
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar12);
    pvVar17 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in3,(size_type)pVStack_cf0);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar17);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar12);
    value_01 = (double *)local_160;
    EvalContext::EvalContext
              ((EvalContext *)local_11d0,fmt_00,(this->m_ctx).precision,(Environment *)value_01,0);
    Statement::execute(stmt,(EvalContext *)local_11d0);
    dVar20 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    if (iVar4 == 1) {
LAB_025b742b:
      pVVar14 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                ::operator*(&(variables->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           );
      pFVar16 = (FloatFormat *)
                Environment::lookup<tcu::Matrix<float,4,4>>((Environment *)local_160,pVVar14);
      convert<tcu::Matrix<float,4,4>>
                (&local_1380,(BuiltinPrecisionTests *)&numErrors,pFVar16,(IVal *)value_01);
      tcu::Matrix<tcu::Interval,_4,_4>::operator=
                ((Matrix<tcu::Interval,_4,_4> *)local_e78,&local_1380);
      tcu::Matrix<tcu::Interval,_4,_4>::~Matrix(&local_1380);
      value_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                 operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                             *)((long)&spec.source.field_2 + 8),(size_type)pVStack_cf0);
      bVar2 = contains<tcu::Matrix<float,4,4>>((IVal *)local_e78,value_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13a0,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.m_str.field_0x177);
      bVar2 = tcu::ResultCollector::check(&this->m_status,bVar2,&local_13a0);
      std::__cxx11::string::~string((string *)&local_13a0);
      dVar20 = (double)std::allocator<char>::~allocator
                                 ((allocator<char> *)&builder.m_str.field_0x177);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar1 = false;
      }
    }
    else if (iVar4 == 2) {
      pVVar12 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                ::operator*(&(variables->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                           );
      value = Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                        ((Environment *)local_160,pVVar12);
      convert<deqp::gls::BuiltinPrecisionTests::Void>((FloatFormat *)&numErrors,value);
      pvVar18 = std::
                vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                              *)&outputs.out0.
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pVStack_cf0);
      bVar1 = contains<deqp::gls::BuiltinPrecisionTests::Void>(&local_e79,pvVar18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11f8,"Shader output 1 is outside acceptable range",&local_11f9);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_11f8);
      std::__cxx11::string::~string((string *)&local_11f8);
      std::allocator<char>::~allocator(&local_11f9);
      bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
      goto LAB_025b742b;
    }
    if ((!bVar1) &&
       (env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1,
       (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      log(this,dVar20);
      tcu::TestLog::message((MessageBuilder *)local_1528,this_05);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1528,(char (*) [7])"Failed");
      tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])" sample:\n");
      if (0 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                  ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                                *)variables);
        Variable<tcu::Matrix<float,4,4>>::getName_abi_cxx11_(&local_1548,pVVar14);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1548);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ::operator[](&inputs->in0,(size_type)pVStack_cf0);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_1568,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_4,_4> *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1568);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_1568);
        std::__cxx11::string::~string((string *)&local_1548);
      }
      if (1 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_1588,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1588);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pvVar17 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in1,(size_type)pVStack_cf0);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_15a8,(FloatFormat *)&numErrors,pvVar17);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_15a8);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_15a8);
        std::__cxx11::string::~string((string *)&local_1588);
      }
      if (2 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in2).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_15c8,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_15c8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pvVar17 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in2,(size_type)pVStack_cf0);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_15e8,(FloatFormat *)&numErrors,pvVar17);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_15e8);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_15e8);
        std::__cxx11::string::~string((string *)&local_15c8);
      }
      if (3 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in3).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_1608,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1608);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pvVar17 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in3,(size_type)pVStack_cf0);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_1628,(FloatFormat *)&numErrors,pvVar17);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1628);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_1628);
        std::__cxx11::string::~string((string *)&local_1608);
      }
      if (0 < iVar4) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                  ::operator->(&(variables->out0).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                              );
        Variable<tcu::Matrix<float,4,4>>::getName_abi_cxx11_(&local_1648,pVVar14);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1648);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                *)((long)&spec.source.field_2 + 8),(size_type)pVStack_cf0);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_1668,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_4,_4> *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1668);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_1688,(BuiltinPrecisionTests *)&numErrors,(FloatFormat *)local_e78,
                   (IVal *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1688);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_1688);
        std::__cxx11::string::~string((string *)&local_1668);
        std::__cxx11::string::~string((string *)&local_1648);
      }
      if (1 < iVar4) {
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1528,(char (*) [2])0x2b88b2a);
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->out1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_16a8,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_16a8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2bdb312);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                *)&outputs.out0.
                                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_cf0);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_16c8,(FloatFormat *)&numErrors,pvVar18);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_16c8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tExpected range: ");
        intervalToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_16e8,(FloatFormat *)&numErrors,&local_e79);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_16e8);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
        std::__cxx11::string::~string((string *)&local_16e8);
        std::__cxx11::string::~string((string *)&local_16c8);
        std::__cxx11::string::~string((string *)&local_16a8);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1528);
    }
    tcu::Matrix<tcu::Interval,_4,_4>::~Matrix((Matrix<tcu::Interval,_4,_4> *)local_e78);
    pVStack_cf0 = pVStack_cf0 + 1;
    uVar19 = extraout_XMM0_Da_04;
    uVar21 = extraout_XMM0_Db_04;
  } while( true );
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}